

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

uint64_t lzma_index_memusage(lzma_vli streams,lzma_vli blocks)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t limit;
  uint64_t index_base;
  uint64_t groups_mem;
  uint64_t streams_mem;
  lzma_vli groups;
  size_t group_base;
  size_t stream_base;
  size_t alloc_overhead;
  lzma_vli blocks_local;
  lzma_vli streams_local;
  
  uVar1 = blocks + 0x1ff >> 9;
  uVar2 = uVar1 * 0x2060;
  if ((((streams == 0) || (0xffffffff < streams)) || (0x7fffffffffffffff < blocks)) ||
     (((0xdd67c8a60dd67c < streams || (0x7e8472a807e84 < uVar1)) ||
      (streams * -0x128 - 0x71 < uVar2)))) {
    streams_local = 0xffffffffffffffff;
  }
  else {
    streams_local = streams * 0x128 + 0x70 + uVar2;
  }
  return streams_local;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_index_memusage(lzma_vli streams, lzma_vli blocks)
{
	// This calculates an upper bound that is only a little bit
	// bigger than the exact maximum memory usage with the given
	// parameters.

	// Typical malloc() overhead is 2 * sizeof(void *) but we take
	// a little bit extra just in case. Using LZMA_MEMUSAGE_BASE
	// instead would give too inaccurate estimate.
	const size_t alloc_overhead = 4 * sizeof(void *);

	// Amount of memory needed for each Stream base structures.
	// We assume that every Stream has at least one Block and
	// thus at least one group.
	const size_t stream_base = sizeof(index_stream)
			+ sizeof(index_group) + 2 * alloc_overhead;

	// Amount of memory needed per group.
	const size_t group_base = sizeof(index_group)
			+ INDEX_GROUP_SIZE * sizeof(index_record)
			+ alloc_overhead;

	// Number of groups. There may actually be more, but that overhead
	// has been taken into account in stream_base already.
	const lzma_vli groups
			= (blocks + INDEX_GROUP_SIZE - 1) / INDEX_GROUP_SIZE;

	// Memory used by index_stream and index_group structures.
	const uint64_t streams_mem = streams * stream_base;
	const uint64_t groups_mem = groups * group_base;

	// Memory used by the base structure.
	const uint64_t index_base = sizeof(lzma_index) + alloc_overhead;

	// Validate the arguments and catch integer overflows.
	// Maximum number of Streams is "only" UINT32_MAX, because
	// that limit is used by the tree containing the Streams.
	const uint64_t limit = UINT64_MAX - index_base;
	if (streams == 0 || streams > UINT32_MAX || blocks > LZMA_VLI_MAX
			|| streams > limit / stream_base
			|| groups > limit / group_base
			|| limit - streams_mem < groups_mem)
		return UINT64_MAX;

	return index_base + streams_mem + groups_mem;
}